

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O1

double anon_unknown.dwarf_1f8e8::sampleY<Imath_3_2::half>
                 (TypedImageChannel<Imath_3_2::half> *channel,int h,int x,double y,Extrapolation ext
                 )

{
  uint x_00;
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  half *phVar5;
  long lVar6;
  uint x_01;
  double dVar7;
  double dVar8;
  
  if (0.0 <= y) {
    x_01 = (uint)y;
  }
  else {
    dVar7 = -y;
    x_01 = -((uint)((double)(int)dVar7 < dVar7) + (int)dVar7);
  }
  x_00 = x_01 + 1;
  switch(ext) {
  case BLACK:
    dVar8 = 0.0;
    dVar7 = 0.0;
    if ((int)x_01 < h && -1 < (int)x_01) {
      dVar7 = (double)*(float *)(_imath_half_to_float_table +
                                (ulong)(channel->_pixels)._data
                                       [(ulong)x_01 * (channel->_pixels)._sizeY + (long)x]._h * 4);
    }
    if (h <= (int)x_00 || (int)x_01 < -1) goto LAB_00109c43;
    phVar5 = (channel->_pixels)._data + (long)(int)x_00 * (channel->_pixels)._sizeY + (long)x;
    break;
  case CLAMP:
    uVar3 = h - 1;
    uVar4 = uVar3;
    if ((int)x_01 < (int)uVar3) {
      uVar4 = x_01;
    }
    if ((int)x_01 < 0) {
      uVar4 = 0;
    }
    if ((int)x_00 < (int)uVar3) {
      uVar3 = x_00;
    }
    if ((int)x_01 < -1) {
      uVar3 = 0;
    }
    lVar6 = (channel->_pixels)._sizeY;
    phVar5 = (channel->_pixels)._data;
    fVar1 = *(float *)(_imath_half_to_float_table +
                      (ulong)phVar5[(int)uVar4 * lVar6 + (long)x]._h * 4);
    goto LAB_00109b57;
  case PERIODIC:
    if ((int)x_01 < 0) {
      if (-1 < h) {
        uVar3 = (~x_01 + h) / (uint)h;
        goto LAB_00109b92;
      }
      uVar3 = (~h - x_01) / (uint)-h;
    }
    else if (h < 0) {
      uVar3 = x_01 / (uint)-h;
LAB_00109b92:
      uVar3 = -uVar3;
    }
    else {
      uVar3 = x_01 / (uint)h;
    }
    if ((int)x_01 < -1) {
      if (-1 < h) {
        uVar4 = ((h - x_01) - 2) / (uint)h;
        goto LAB_00109be0;
      }
      uVar4 = (~h - x_00) / (uint)-h;
    }
    else if (h < 0) {
      uVar4 = x_00 / (uint)-h;
LAB_00109be0:
      uVar4 = -uVar4;
    }
    else {
      uVar4 = x_00 / (uint)h;
    }
    lVar6 = (channel->_pixels)._sizeY;
    phVar5 = (channel->_pixels)._data;
    dVar7 = (double)*(float *)(_imath_half_to_float_table +
                              (ulong)phVar5[(int)(x_01 - uVar3 * h) * lVar6 + (long)x]._h * 4);
    phVar5 = phVar5 + (int)(x_00 - uVar4 * h) * lVar6 + (long)x;
    break;
  case MIRROR:
    iVar2 = mirror(x_01,h);
    uVar3 = mirror(x_00,h);
    lVar6 = (channel->_pixels)._sizeY;
    phVar5 = (channel->_pixels)._data;
    fVar1 = *(float *)(_imath_half_to_float_table + (ulong)phVar5[iVar2 * lVar6 + (long)x]._h * 4);
LAB_00109b57:
    dVar7 = (double)fVar1;
    phVar5 = phVar5 + (int)uVar3 * lVar6 + (long)x;
    break;
  default:
    dVar7 = 0.0;
    dVar8 = 0.0;
    goto LAB_00109c43;
  }
  dVar8 = (double)*(float *)(_imath_half_to_float_table + (ulong)phVar5->_h * 4);
LAB_00109c43:
  return ((double)(int)x_00 - y) * dVar7 + (1.0 - ((double)(int)x_00 - y)) * dVar8;
}

Assistant:

double
sampleY (
    const TypedImageChannel<T>& channel,
    int                         h,
    int                         x,
    double                      y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is an integer, and y is a floating point number.
    //

    int    ys = IMATH_NAMESPACE::floor (y);
    int    yt = ys + 1;
    double s  = yt - y;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (ys >= 0 && ys < h) ? double (channel (x, ys)) : 0.0;
            vt = (yt >= 0 && yt < h) ? double (channel (x, yt)) : 0.0;
            break;

        case CLAMP:

            ys = IMATH_NAMESPACE::clamp (ys, 0, h - 1);
            yt = IMATH_NAMESPACE::clamp (yt, 0, h - 1);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case PERIODIC:

            ys = modp (ys, h);
            yt = modp (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case MIRROR:

            ys = mirror (ys, h);
            yt = mirror (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;
    }

    return s * vs + t * vt;
}